

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  size_t sVar10;
  undefined8 uVar11;
  Scene *pSVar12;
  Ref<embree::Geometry> *pRVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [12];
  byte bVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  size_t sVar38;
  size_t i;
  long lVar39;
  long lVar40;
  ulong uVar41;
  float fVar42;
  uint uVar43;
  float fVar44;
  float fVar60;
  float fVar63;
  vint4 bi;
  uint uVar61;
  uint uVar64;
  float fVar66;
  uint uVar67;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar62;
  float fVar65;
  float fVar68;
  float fVar69;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar70;
  float fVar71;
  int iVar79;
  int iVar82;
  vint4 bi_1;
  float fVar80;
  float fVar81;
  float fVar83;
  float fVar84;
  int iVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar97;
  float fVar102;
  vint4 ai;
  uint uVar89;
  uint uVar98;
  uint uVar103;
  float fVar107;
  uint uVar108;
  undefined1 auVar93 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar112;
  float fVar113;
  float fVar120;
  float fVar122;
  vint4 ai_1;
  undefined1 auVar114 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar126;
  int iVar128;
  float fVar129;
  int iVar130;
  float fVar131;
  int iVar132;
  float fVar133;
  undefined1 auVar127 [16];
  float fVar134;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar142;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  float local_11e8;
  float fStack_11e4;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined1 local_1188 [4] [16];
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [8];
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  pauVar35 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar27 = (tray->tnear).field_0.i[k];
  iVar28 = (tray->tfar).field_0.i[k];
  local_fd8 = mm_lookupmask_ps._0_8_;
  uStack_fd0 = mm_lookupmask_ps._8_8_;
  local_fe8 = mm_lookupmask_ps._240_8_;
  uStack_fe0 = mm_lookupmask_ps._248_8_;
  local_fc8 = iVar27;
  iStack_fc4 = iVar27;
  iStack_fc0 = iVar27;
  iStack_fbc = iVar27;
  iVar79 = iVar28;
  iVar82 = iVar28;
  iVar85 = iVar28;
  iVar128 = iVar27;
  iVar130 = iVar27;
  iVar132 = iVar27;
LAB_00704502:
  do {
    do {
      if (pauVar35 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar31 = pauVar35 + -1;
      pauVar35 = pauVar35 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)((long)*pauVar31 + 8) &&
             *(float *)((long)*pauVar31 + 8) != *(float *)(ray + k * 4 + 0x80));
    pauVar31 = (undefined1 (*) [16])&local_f78;
    sVar38 = *(size_t *)*pauVar35;
    while ((sVar38 & 8) == 0) {
      pfVar1 = (float *)(sVar38 + 0x20 + uVar33);
      fVar42 = (*pfVar1 - fVar4) * fVar7;
      fVar60 = (pfVar1[1] - fVar4) * fVar7;
      fVar63 = (pfVar1[2] - fVar4) * fVar7;
      fVar66 = (pfVar1[3] - fVar4) * fVar7;
      pfVar1 = (float *)(sVar38 + 0x20 + uVar36);
      fVar88 = (*pfVar1 - fVar5) * fVar8;
      fVar97 = (pfVar1[1] - fVar5) * fVar8;
      fVar102 = (pfVar1[2] - fVar5) * fVar8;
      fVar107 = (pfVar1[3] - fVar5) * fVar8;
      uVar89 = (uint)((int)fVar88 < (int)fVar42) * (int)fVar42 |
               (uint)((int)fVar88 >= (int)fVar42) * (int)fVar88;
      uVar98 = (uint)((int)fVar97 < (int)fVar60) * (int)fVar60 |
               (uint)((int)fVar97 >= (int)fVar60) * (int)fVar97;
      uVar103 = (uint)((int)fVar102 < (int)fVar63) * (int)fVar63 |
                (uint)((int)fVar102 >= (int)fVar63) * (int)fVar102;
      uVar108 = (uint)((int)fVar107 < (int)fVar66) * (int)fVar66 |
                (uint)((int)fVar107 >= (int)fVar66) * (int)fVar107;
      pfVar1 = (float *)(sVar38 + 0x20 + uVar37);
      fVar42 = (*pfVar1 - fVar6) * fVar9;
      fVar60 = (pfVar1[1] - fVar6) * fVar9;
      fVar63 = (pfVar1[2] - fVar6) * fVar9;
      fVar66 = (pfVar1[3] - fVar6) * fVar9;
      uVar43 = (uint)((int)fVar42 < iVar27) * iVar27 | (uint)((int)fVar42 >= iVar27) * (int)fVar42;
      uVar61 = (uint)((int)fVar60 < iVar128) * iVar128 |
               (uint)((int)fVar60 >= iVar128) * (int)fVar60;
      uVar64 = (uint)((int)fVar63 < iVar130) * iVar130 |
               (uint)((int)fVar63 >= iVar130) * (int)fVar63;
      uVar67 = (uint)((int)fVar66 < iVar132) * iVar132 |
               (uint)((int)fVar66 >= iVar132) * (int)fVar66;
      local_10f8._0_4_ =
           ((int)uVar43 < (int)uVar89) * uVar89 | ((int)uVar43 >= (int)uVar89) * uVar43;
      local_10f8._4_4_ =
           ((int)uVar61 < (int)uVar98) * uVar98 | ((int)uVar61 >= (int)uVar98) * uVar61;
      fStack_10f0 = (float)(((int)uVar64 < (int)uVar103) * uVar103 |
                           ((int)uVar64 >= (int)uVar103) * uVar64);
      fStack_10ec = (float)(((int)uVar67 < (int)uVar108) * uVar108 |
                           ((int)uVar67 >= (int)uVar108) * uVar67);
      pfVar1 = (float *)(sVar38 + 0x20 + (uVar33 ^ 0x10));
      fVar42 = (*pfVar1 - fVar4) * fVar7;
      fVar60 = (pfVar1[1] - fVar4) * fVar7;
      fVar63 = (pfVar1[2] - fVar4) * fVar7;
      fVar66 = (pfVar1[3] - fVar4) * fVar7;
      pfVar1 = (float *)(sVar38 + 0x20 + (uVar36 ^ 0x10));
      fVar88 = (*pfVar1 - fVar5) * fVar8;
      fVar97 = (pfVar1[1] - fVar5) * fVar8;
      fVar102 = (pfVar1[2] - fVar5) * fVar8;
      fVar107 = (pfVar1[3] - fVar5) * fVar8;
      uVar89 = (uint)((int)fVar42 < (int)fVar88) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar88) * (int)fVar88;
      uVar98 = (uint)((int)fVar60 < (int)fVar97) * (int)fVar60 |
               (uint)((int)fVar60 >= (int)fVar97) * (int)fVar97;
      uVar103 = (uint)((int)fVar63 < (int)fVar102) * (int)fVar63 |
                (uint)((int)fVar63 >= (int)fVar102) * (int)fVar102;
      uVar108 = (uint)((int)fVar66 < (int)fVar107) * (int)fVar66 |
                (uint)((int)fVar66 >= (int)fVar107) * (int)fVar107;
      pfVar1 = (float *)(sVar38 + 0x20 + (uVar37 ^ 0x10));
      fVar42 = (*pfVar1 - fVar6) * fVar9;
      fVar60 = (pfVar1[1] - fVar6) * fVar9;
      fVar63 = (pfVar1[2] - fVar6) * fVar9;
      fVar66 = (pfVar1[3] - fVar6) * fVar9;
      uVar43 = (uint)(iVar28 < (int)fVar42) * iVar28 | (uint)(iVar28 >= (int)fVar42) * (int)fVar42;
      uVar61 = (uint)(iVar79 < (int)fVar60) * iVar79 | (uint)(iVar79 >= (int)fVar60) * (int)fVar60;
      uVar64 = (uint)(iVar82 < (int)fVar63) * iVar82 | (uint)(iVar82 >= (int)fVar63) * (int)fVar63;
      uVar67 = (uint)(iVar85 < (int)fVar66) * iVar85 | (uint)(iVar85 >= (int)fVar66) * (int)fVar66;
      auVar93._0_4_ =
           -(uint)((int)(((int)uVar89 < (int)uVar43) * uVar89 |
                        ((int)uVar89 >= (int)uVar43) * uVar43) < (int)local_10f8._0_4_);
      auVar93._4_4_ =
           -(uint)((int)(((int)uVar98 < (int)uVar61) * uVar98 |
                        ((int)uVar98 >= (int)uVar61) * uVar61) < (int)local_10f8._4_4_);
      auVar93._8_4_ =
           -(uint)((int)(((int)uVar103 < (int)uVar64) * uVar103 |
                        ((int)uVar103 >= (int)uVar64) * uVar64) < (int)fStack_10f0);
      auVar93._12_4_ =
           -(uint)((int)(((int)uVar108 < (int)uVar67) * uVar108 |
                        ((int)uVar108 >= (int)uVar67) * uVar67) < (int)fStack_10ec);
      iVar26 = movmskps((int)pauVar31,auVar93);
      if (iVar26 == 0xf) goto LAB_00704502;
      bVar25 = (byte)iVar26 ^ 0xf;
      uVar41 = sVar38 & 0xfffffffffffffff0;
      lVar39 = 0;
      if (bVar25 != 0) {
        for (; (bVar25 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
        }
      }
      sVar38 = *(size_t *)(uVar41 + lVar39 * 8);
      uVar43 = bVar25 - 1 & (uint)bVar25;
      pauVar31 = pauVar35;
      if (uVar43 != 0) {
        uVar61 = *(uint *)(local_10f8 + lVar39 * 4);
        lVar39 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
          }
        }
        sVar10 = *(size_t *)(uVar41 + lVar39 * 8);
        uVar64 = *(uint *)(local_10f8 + lVar39 * 4);
        uVar43 = uVar43 - 1 & uVar43;
        if (uVar43 == 0) {
          pauVar31 = pauVar35 + 1;
          if (uVar61 < uVar64) {
            *(size_t *)*pauVar35 = sVar10;
            *(uint *)((long)*pauVar35 + 8) = uVar64;
            pauVar35 = pauVar31;
          }
          else {
            *(size_t *)*pauVar35 = sVar38;
            *(uint *)((long)*pauVar35 + 8) = uVar61;
            pauVar35 = pauVar31;
            sVar38 = sVar10;
          }
        }
        else {
          auVar114._8_4_ = uVar61;
          auVar114._0_8_ = sVar38;
          auVar114._12_4_ = 0;
          auVar136._8_4_ = uVar64;
          auVar136._0_8_ = sVar10;
          auVar136._12_4_ = 0;
          lVar39 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar11 = *(undefined8 *)(uVar41 + lVar39 * 8);
          iVar26 = *(int *)(local_10f8 + lVar39 * 4);
          auVar148._8_4_ = iVar26;
          auVar148._0_8_ = uVar11;
          auVar148._12_4_ = 0;
          auVar145._8_4_ = -(uint)((int)uVar61 < (int)uVar64);
          uVar43 = uVar43 - 1 & uVar43;
          if (uVar43 == 0) {
            auVar145._4_4_ = auVar145._8_4_;
            auVar145._0_4_ = auVar145._8_4_;
            auVar145._12_4_ = auVar145._8_4_;
            auVar143._8_4_ = uVar64;
            auVar143._0_8_ = sVar10;
            auVar143._12_4_ = 0;
            auVar144 = blendvps(auVar143,auVar114,auVar145);
            auVar93 = blendvps(auVar114,auVar136,auVar145);
            auVar45._8_4_ = -(uint)(auVar144._8_4_ < iVar26);
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar135._8_4_ = iVar26;
            auVar135._0_8_ = uVar11;
            auVar135._12_4_ = 0;
            auVar136 = blendvps(auVar135,auVar144,auVar45);
            auVar145 = blendvps(auVar144,auVar148,auVar45);
            auVar46._8_4_ = -(uint)(auVar93._8_4_ < auVar145._8_4_);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            auVar114 = blendvps(auVar145,auVar93,auVar46);
            auVar93 = blendvps(auVar93,auVar145,auVar46);
            *pauVar35 = auVar93;
            pauVar35[1] = auVar114;
            sVar38 = auVar136._0_8_;
            pauVar31 = pauVar35 + 2;
            pauVar35 = pauVar31;
          }
          else {
            lVar39 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            auVar144._4_4_ = auVar145._8_4_;
            auVar144._0_4_ = auVar145._8_4_;
            auVar144._8_4_ = auVar145._8_4_;
            auVar144._12_4_ = auVar145._8_4_;
            auVar145 = blendvps(auVar136,auVar114,auVar144);
            auVar93 = blendvps(auVar114,auVar136,auVar144);
            auVar147._8_4_ = *(int *)(local_10f8 + lVar39 * 4);
            auVar147._0_8_ = *(undefined8 *)(uVar41 + lVar39 * 8);
            auVar147._12_4_ = 0;
            auVar47._8_4_ = -(uint)(iVar26 < *(int *)(local_10f8 + lVar39 * 4));
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            auVar136 = blendvps(auVar147,auVar148,auVar47);
            auVar114 = blendvps(auVar148,auVar147,auVar47);
            auVar48._8_4_ = -(uint)(auVar93._8_4_ < auVar114._8_4_);
            auVar48._4_4_ = auVar48._8_4_;
            auVar48._0_4_ = auVar48._8_4_;
            auVar48._12_4_ = auVar48._8_4_;
            auVar148 = blendvps(auVar114,auVar93,auVar48);
            auVar93 = blendvps(auVar93,auVar114,auVar48);
            auVar49._8_4_ = -(uint)(auVar145._8_4_ < auVar136._8_4_);
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            auVar114 = blendvps(auVar136,auVar145,auVar49);
            auVar145 = blendvps(auVar145,auVar136,auVar49);
            auVar50._8_4_ = -(uint)(auVar145._8_4_ < auVar148._8_4_);
            auVar50._4_4_ = auVar50._8_4_;
            auVar50._0_4_ = auVar50._8_4_;
            auVar50._12_4_ = auVar50._8_4_;
            auVar136 = blendvps(auVar148,auVar145,auVar50);
            auVar145 = blendvps(auVar145,auVar148,auVar50);
            *pauVar35 = auVar93;
            pauVar35[1] = auVar145;
            pauVar35[2] = auVar136;
            sVar38 = auVar114._0_8_;
            pauVar31 = pauVar35 + 3;
            pauVar35 = pauVar31;
          }
        }
      }
    }
    uVar41 = sVar38 & 0xfffffffffffffff0;
    for (lVar39 = 0; lVar39 != (ulong)((uint)sVar38 & 0xf) - 8; lVar39 = lVar39 + 1) {
      lVar34 = lVar39 * 0xe0;
      puVar3 = (undefined8 *)(uVar41 + 0xd0 + lVar34);
      local_ff8 = *puVar3;
      uStack_ff0 = puVar3[1];
      pfVar1 = (float *)(uVar41 + lVar34);
      fVar60 = *pfVar1;
      fVar63 = pfVar1[1];
      fVar66 = pfVar1[2];
      fVar88 = pfVar1[3];
      pfVar1 = (float *)(uVar41 + 0x10 + lVar34);
      fVar97 = *pfVar1;
      fVar102 = pfVar1[1];
      fVar107 = pfVar1[2];
      fVar159 = pfVar1[3];
      pauVar2 = (undefined1 (*) [12])(uVar41 + 0x20 + lVar34);
      auVar24 = *pauVar2;
      fVar69 = *(float *)pauVar2[1];
      pfVar1 = (float *)(uVar41 + 0x40 + lVar34);
      local_11f8 = *(undefined8 *)pfVar1;
      uStack_11f0 = *(undefined8 *)(pfVar1 + 2);
      fVar90 = fVar97 - *pfVar1;
      fVar99 = fVar102 - pfVar1[1];
      fVar104 = fVar107 - pfVar1[2];
      fVar109 = fVar159 - pfVar1[3];
      pfVar1 = (float *)(uVar41 + 0x50 + lVar34);
      local_11b8 = *(undefined8 *)pfVar1;
      uStack_11b0 = *(undefined8 *)(pfVar1 + 2);
      fVar91 = *(float *)*pauVar2 - *pfVar1;
      fVar100 = *(float *)(*pauVar2 + 4) - pfVar1[1];
      fVar105 = *(float *)(*pauVar2 + 8) - pfVar1[2];
      fVar110 = fVar69 - pfVar1[3];
      pfVar1 = (float *)(uVar41 + 0x90 + lVar34);
      local_1128 = *pfVar1;
      fStack_1124 = pfVar1[1];
      fStack_1120 = pfVar1[2];
      fStack_111c = pfVar1[3];
      fVar44 = local_1128 - fVar60;
      fVar62 = fStack_1124 - fVar63;
      fVar65 = fStack_1120 - fVar66;
      fVar68 = fStack_111c - fVar88;
      pfVar1 = (float *)(uVar41 + 0xa0 + lVar34);
      local_1138 = *pfVar1;
      fStack_1134 = pfVar1[1];
      fStack_1130 = pfVar1[2];
      fStack_112c = pfVar1[3];
      fVar152 = local_1138 - fVar97;
      fVar153 = fStack_1134 - fVar102;
      fVar154 = fStack_1130 - fVar107;
      fVar155 = fStack_112c - fVar159;
      pfVar1 = (float *)(uVar41 + 0xb0 + lVar34);
      local_1148 = *pfVar1;
      fStack_1144 = pfVar1[1];
      fStack_1140 = pfVar1[2];
      fStack_113c = pfVar1[3];
      fVar112 = local_1148 - *(float *)*pauVar2;
      fVar120 = fStack_1144 - *(float *)(*pauVar2 + 4);
      fVar122 = fStack_1140 - *(float *)(*pauVar2 + 8);
      fVar124 = fStack_113c - fVar69;
      fVar113 = fVar91 * fVar152 - fVar90 * fVar112;
      fVar121 = fVar100 * fVar153 - fVar99 * fVar120;
      fVar123 = fVar105 * fVar154 - fVar104 * fVar122;
      fVar125 = fVar110 * fVar155 - fVar109 * fVar124;
      local_1108 = *(float *)(ray + k * 4);
      local_f98 = *(float *)(ray + k * 4 + 0x10);
      local_f88 = *(float *)(ray + k * 4 + 0x40);
      local_1008 = *(float *)(ray + k * 4 + 0x50);
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      local_fb8 = fVar60 - local_1108;
      fStack_fb4 = fVar63 - local_1108;
      fStack_fb0 = fVar66 - local_1108;
      fStack_fac = fVar88 - local_1108;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fVar97 = fVar97 - local_f98;
      fVar102 = fVar102 - local_f98;
      fVar107 = fVar107 - local_f98;
      fVar159 = fVar159 - local_f98;
      fVar156 = local_fb8 * local_1008 - fVar97 * local_f88;
      fVar157 = fStack_fb4 * local_1008 - fVar102 * local_f88;
      fVar158 = fStack_fb0 * local_1008 - fVar107 * local_f88;
      fVar160 = fStack_fac * local_1008 - fVar159 * local_f88;
      pfVar1 = (float *)(uVar41 + 0x30 + lVar34);
      local_1118 = *pfVar1;
      fStack_1114 = pfVar1[1];
      fStack_1110 = pfVar1[2];
      fStack_110c = pfVar1[3];
      fVar60 = fVar60 - local_1118;
      fVar63 = fVar63 - fStack_1114;
      fVar66 = fVar66 - fStack_1110;
      fVar88 = fVar88 - fStack_110c;
      fVar126 = fVar60 * fVar112 - fVar91 * fVar44;
      fVar129 = fVar63 * fVar120 - fVar100 * fVar62;
      fVar131 = fVar66 * fVar122 - fVar105 * fVar65;
      fVar133 = fVar88 * fVar124 - fVar110 * fVar68;
      local_fa8 = *(float *)(ray + k * 4 + 0x20);
      fVar42 = *(float *)(ray + k * 4 + 0x60);
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      local_11e8 = auVar24._0_4_;
      fStack_11e4 = auVar24._4_4_;
      uStack_11e0._0_4_ = auVar24._8_4_;
      local_11e8 = local_11e8 - local_fa8;
      fStack_11e4 = fStack_11e4 - local_fa8;
      uStack_11e0._0_4_ = (float)uStack_11e0 - local_fa8;
      fVar69 = fVar69 - local_fa8;
      fVar134 = local_11e8 * local_f88 - local_fb8 * fVar42;
      fVar140 = fStack_11e4 * local_f88 - fStack_fb4 * fVar42;
      fVar141 = (float)uStack_11e0 * local_f88 - fStack_fb0 * fVar42;
      fVar142 = fVar69 * local_f88 - fStack_fac * fVar42;
      fVar70 = fVar90 * fVar44 - fVar60 * fVar152;
      fVar80 = fVar99 * fVar62 - fVar63 * fVar153;
      fVar83 = fVar104 * fVar65 - fVar66 * fVar154;
      fVar86 = fVar109 * fVar68 - fVar88 * fVar155;
      fVar92 = fVar97 * fVar42 - local_11e8 * local_1008;
      fVar101 = fVar102 * fVar42 - fStack_11e4 * local_1008;
      fVar106 = fVar107 * fVar42 - (float)uStack_11e0 * local_1008;
      fVar111 = fVar159 * fVar42 - fVar69 * local_1008;
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      fVar71 = fVar113 * local_f88 + fVar126 * local_1008 + fVar70 * fVar42;
      fVar81 = fVar121 * local_f88 + fVar129 * local_1008 + fVar80 * fVar42;
      fVar84 = fVar123 * local_f88 + fVar131 * local_1008 + fVar83 * fVar42;
      fVar87 = fVar125 * local_f88 + fVar133 * local_1008 + fVar86 * fVar42;
      uVar61 = (uint)fVar71 & 0x80000000;
      uVar64 = (uint)fVar81 & 0x80000000;
      uVar67 = (uint)fVar84 & 0x80000000;
      uVar89 = (uint)fVar87 & 0x80000000;
      local_10f8._0_4_ = (uint)(fVar44 * fVar92 + fVar152 * fVar134 + fVar112 * fVar156) ^ uVar61;
      local_10f8._4_4_ = (uint)(fVar62 * fVar101 + fVar153 * fVar140 + fVar120 * fVar157) ^ uVar64;
      fStack_10f0 = (float)((uint)(fVar65 * fVar106 + fVar154 * fVar141 + fVar122 * fVar158) ^
                           uVar67);
      fStack_10ec = (float)((uint)(fVar68 * fVar111 + fVar155 * fVar142 + fVar124 * fVar160) ^
                           uVar89);
      local_10e8._0_4_ = (uint)(fVar92 * fVar60 + fVar134 * fVar90 + fVar156 * fVar91) ^ uVar61;
      local_10e8._4_4_ = (uint)(fVar101 * fVar63 + fVar140 * fVar99 + fVar157 * fVar100) ^ uVar64;
      fStack_10e0 = (float)((uint)(fVar106 * fVar66 + fVar141 * fVar104 + fVar158 * fVar105) ^
                           uVar67);
      fStack_10dc = (float)((uint)(fVar111 * fVar88 + fVar142 * fVar109 + fVar160 * fVar110) ^
                           uVar89);
      fVar60 = ABS(fVar71);
      fVar63 = ABS(fVar81);
      local_10c8._0_8_ = CONCAT44(fVar81,fVar71) & 0x7fffffff7fffffff;
      local_10c8._8_4_ = ABS(fVar84);
      local_10c8._12_4_ = ABS(fVar87);
      bVar22 = (float)local_10f8._0_4_ + (float)local_10e8._0_4_ <= fVar60 &&
               ((0.0 <= (float)local_10e8._0_4_ && 0.0 <= (float)local_10f8._0_4_) && fVar71 != 0.0)
      ;
      auVar115._0_4_ = -(uint)bVar22;
      bVar23 = (float)local_10f8._4_4_ + (float)local_10e8._4_4_ <= fVar63 &&
               ((0.0 <= (float)local_10e8._4_4_ && 0.0 <= (float)local_10f8._4_4_) && fVar81 != 0.0)
      ;
      auVar115._4_4_ = -(uint)bVar23;
      bVar21 = fStack_10f0 + fStack_10e0 <= local_10c8._8_4_ &&
               ((0.0 <= fStack_10e0 && 0.0 <= fStack_10f0) && fVar84 != 0.0);
      auVar115._8_4_ = -(uint)bVar21;
      bVar20 = fStack_10ec + fStack_10dc <= local_10c8._12_4_ &&
               ((0.0 <= fStack_10dc && 0.0 <= fStack_10ec) && fVar87 != 0.0);
      auVar115._12_4_ = -(uint)bVar20;
      lVar34 = lVar34 + uVar41;
      uVar43 = movmskps((int)pauVar31,auVar115);
      fStack_1104 = local_1108;
      fStack_1100 = local_1108;
      fStack_10fc = local_1108;
      if (uVar43 != 0) {
        local_10d8._0_4_ =
             uVar61 ^ (uint)(local_fb8 * fVar113 + fVar97 * fVar126 + local_11e8 * fVar70);
        local_10d8._4_4_ =
             uVar64 ^ (uint)(fStack_fb4 * fVar121 + fVar102 * fVar129 + fStack_11e4 * fVar80);
        fStack_10d0 = (float)(uVar67 ^ (uint)(fStack_fb0 * fVar123 +
                                             fVar107 * fVar131 + (float)uStack_11e0 * fVar83));
        fStack_10cc = (float)(uVar89 ^ (uint)(fStack_fac * fVar125 +
                                             fVar159 * fVar133 + fVar69 * fVar86));
        fVar66 = *(float *)(ray + k * 4 + 0x30);
        fVar88 = *(float *)(ray + k * 4 + 0x80);
        bVar14 = fVar66 * fVar60 < (float)local_10d8._0_4_;
        bVar15 = fVar66 * fVar63 < (float)local_10d8._4_4_;
        bVar16 = fVar66 * local_10c8._8_4_ < fStack_10d0;
        bVar17 = fVar66 * local_10c8._12_4_ < fStack_10cc;
        auVar72._4_4_ = -(uint)bVar15;
        auVar72._0_4_ = -(uint)bVar14;
        auVar72._8_4_ = -(uint)bVar16;
        auVar72._12_4_ = -(uint)bVar17;
        bVar22 = ((float)local_10d8._0_4_ <= fVar88 * fVar60 && bVar14) && bVar22;
        bVar23 = ((float)local_10d8._4_4_ <= fVar88 * fVar63 && bVar15) && bVar23;
        local_1188[0]._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
        bVar21 = (fStack_10d0 <= fVar88 * local_10c8._8_4_ && bVar16) && bVar21;
        local_1188[0]._8_4_ = -(uint)bVar21;
        bVar20 = (fStack_10cc <= fVar88 * local_10c8._12_4_ && bVar17) && bVar20;
        local_1188[0]._12_4_ = -(uint)bVar20;
        uVar43 = movmskps(uVar43,local_1188[0]);
        if (uVar43 != 0) {
          local_10b8 = CONCAT44(fVar121,fVar113);
          uStack_10b0 = CONCAT44(fVar125,fVar123);
          local_10a8 = CONCAT44(fVar129,fVar126);
          uStack_10a0 = CONCAT44(fVar133,fVar131);
          local_1098 = CONCAT44(fVar80,fVar70);
          uStack_1090 = CONCAT44(fVar86,fVar83);
          local_1088 = local_1188[0];
          local_1018._8_8_ = uStack_fd0;
          local_1018._0_8_ = local_fd8;
          pSVar12 = context->scene;
          auVar93 = rcpps(auVar72,local_10c8);
          fVar66 = auVar93._0_4_;
          fVar88 = auVar93._4_4_;
          fVar97 = auVar93._8_4_;
          fVar102 = auVar93._12_4_;
          fVar69 = DAT_01f46a60._4_4_;
          fVar44 = DAT_01f46a60._12_4_;
          fVar107 = (float)DAT_01f46a60;
          fVar159 = DAT_01f46a60._8_4_;
          fVar66 = (fVar107 - fVar60 * fVar66) * fVar66 + fVar66;
          fVar88 = (fVar69 - fVar63 * fVar88) * fVar88 + fVar88;
          fVar97 = (fVar159 - local_10c8._8_4_ * fVar97) * fVar97 + fVar97;
          fVar102 = (fVar44 - local_10c8._12_4_ * fVar102) * fVar102 + fVar102;
          local_1058._0_4_ = (float)local_10d8._0_4_ * fVar66;
          local_1058._4_4_ = (float)local_10d8._4_4_ * fVar88;
          fStack_1050 = fStack_10d0 * fVar97;
          fStack_104c = fStack_10cc * fVar102;
          auVar127._0_4_ = (float)local_10f8._0_4_ * fVar66;
          auVar127._4_4_ = (float)local_10f8._4_4_ * fVar88;
          auVar127._8_4_ = fStack_10f0 * fVar97;
          auVar127._12_4_ = fStack_10ec * fVar102;
          auVar114 = minps(auVar127,_DAT_01f46a60);
          auVar116._0_4_ = fVar66 * (float)local_10e8._0_4_;
          auVar116._4_4_ = fVar88 * (float)local_10e8._4_4_;
          auVar116._8_4_ = fVar97 * fStack_10e0;
          auVar116._12_4_ = fVar102 * fStack_10dc;
          auVar93 = minps(auVar116,_DAT_01f46a60);
          auVar73._0_4_ = fVar107 - auVar114._0_4_;
          auVar73._4_4_ = fVar69 - auVar114._4_4_;
          auVar73._8_4_ = fVar159 - auVar114._8_4_;
          auVar73._12_4_ = fVar44 - auVar114._12_4_;
          auVar94._0_4_ = fVar107 - auVar93._0_4_;
          auVar94._4_4_ = fVar69 - auVar93._4_4_;
          auVar94._8_4_ = fVar159 - auVar93._8_4_;
          auVar94._12_4_ = fVar44 - auVar93._12_4_;
          local_1078 = blendvps(auVar114,auVar73,local_1018);
          local_1068 = blendvps(auVar93,auVar94,local_1018);
          local_1048 = CONCAT44(fVar121,fVar113);
          uStack_1040 = CONCAT44(fVar125,fVar123);
          local_1038 = CONCAT44(fVar129,fVar126);
          uStack_1030 = CONCAT44(fVar133,fVar131);
          local_1028 = CONCAT44(fVar80,fVar70);
          uStack_1020 = CONCAT44(fVar86,fVar83);
          auVar51._8_4_ = local_1188[0]._8_4_;
          auVar51._0_8_ = local_1188[0]._0_8_;
          auVar51._12_4_ = local_1188[0]._12_4_;
          auVar137._4_4_ = local_1058._4_4_;
          auVar137._0_4_ = local_1058._0_4_;
          auVar137._8_4_ = fStack_1050;
          auVar137._12_4_ = fStack_104c;
          auVar19._4_4_ = local_1058._4_4_;
          auVar19._0_4_ = local_1058._0_4_;
          auVar19._8_4_ = fStack_1050;
          auVar19._12_4_ = fStack_104c;
          auVar114 = blendvps(_DAT_01f45a30,auVar19,auVar51);
          auVar95._4_4_ = auVar114._0_4_;
          auVar95._0_4_ = auVar114._4_4_;
          auVar95._8_4_ = auVar114._12_4_;
          auVar95._12_4_ = auVar114._8_4_;
          auVar93 = minps(auVar95,auVar114);
          auVar52._0_8_ = auVar93._8_8_;
          auVar52._8_4_ = auVar93._0_4_;
          auVar52._12_4_ = auVar93._4_4_;
          auVar93 = minps(auVar52,auVar93);
          auVar53._0_8_ =
               CONCAT44(-(uint)(auVar93._4_4_ == auVar114._4_4_ && bVar23),
                        -(uint)(auVar93._0_4_ == auVar114._0_4_ && bVar22));
          auVar53._8_4_ = -(uint)(auVar93._8_4_ == auVar114._8_4_ && bVar21);
          auVar53._12_4_ = -(uint)(auVar93._12_4_ == auVar114._12_4_ && bVar20);
          iVar27 = movmskps((int)pSVar12,auVar53);
          auVar150 = local_1188[0];
          if (iVar27 != 0) {
            auVar150._8_4_ = auVar53._8_4_;
            auVar150._0_8_ = auVar53._0_8_;
            auVar150._12_4_ = auVar53._12_4_;
          }
          uVar29 = movmskps(iVar27,auVar150);
          uVar32 = CONCAT44((int)((ulong)pSVar12 >> 0x20),uVar29);
          lVar40 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
            }
          }
          pRVar13 = (pSVar12->geometries).items;
          uVar43 = *(uint *)(ray + k * 4 + 0x90);
          while (uVar61 = *(uint *)(lVar34 + 0xc0 + lVar40 * 4),
                ((pRVar13[uVar61].ptr)->mask & uVar43) == 0) {
            *(undefined4 *)(local_1188[0] + lVar40 * 4) = 0;
            iVar27 = movmskps((int)lVar40,local_1188[0]);
            if (iVar27 == 0) {
              uVar43 = 0;
              goto LAB_00704a85;
            }
            auVar114 = blendvps(_DAT_01f45a30,auVar137,local_1188[0]);
            auVar117._4_4_ = auVar114._0_4_;
            auVar117._0_4_ = auVar114._4_4_;
            auVar117._8_4_ = auVar114._12_4_;
            auVar117._12_4_ = auVar114._8_4_;
            auVar93 = minps(auVar117,auVar114);
            auVar74._0_8_ = auVar93._8_8_;
            auVar74._8_4_ = auVar93._0_4_;
            auVar74._12_4_ = auVar93._4_4_;
            auVar93 = minps(auVar74,auVar93);
            auVar75._0_8_ =
                 CONCAT44(-(uint)(auVar93._4_4_ == auVar114._4_4_) & local_1188[0]._4_4_,
                          -(uint)(auVar93._0_4_ == auVar114._0_4_) & local_1188[0]._0_4_);
            auVar75._8_4_ = -(uint)(auVar93._8_4_ == auVar114._8_4_) & local_1188[0]._8_4_;
            auVar75._12_4_ = -(uint)(auVar93._12_4_ == auVar114._12_4_) & local_1188[0]._12_4_;
            iVar27 = movmskps(iVar27,auVar75);
            auVar54 = local_1188[0];
            if (iVar27 != 0) {
              auVar54._8_4_ = auVar75._8_4_;
              auVar54._0_8_ = auVar75._0_8_;
              auVar54._12_4_ = auVar75._12_4_;
            }
            uVar29 = movmskps(iVar27,auVar54);
            uVar32 = CONCAT44((int)((ulong)lVar40 >> 0x20),uVar29);
            lVar40 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
          }
          uVar29 = *(undefined4 *)(local_1078 + lVar40 * 4);
          uVar30 = *(undefined4 *)(local_1068 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1058 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_1048 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_1038 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_1028 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar30;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_ff8 + lVar40 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar61;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar43 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar43;
          local_1118 = *(float *)(lVar34 + 0x30);
          fStack_1114 = *(float *)(lVar34 + 0x34);
          fStack_1110 = *(float *)(lVar34 + 0x38);
          fStack_110c = *(float *)(lVar34 + 0x3c);
          local_11f8 = *(undefined8 *)(lVar34 + 0x40);
          uStack_11f0 = *(undefined8 *)(lVar34 + 0x48);
          local_11b8 = *(undefined8 *)(lVar34 + 0x50);
          uStack_11b0 = *(undefined8 *)(lVar34 + 0x58);
          local_1128 = *(float *)(lVar34 + 0x90);
          fStack_1124 = *(float *)(lVar34 + 0x94);
          fStack_1120 = *(float *)(lVar34 + 0x98);
          fStack_111c = *(float *)(lVar34 + 0x9c);
          local_1138 = *(float *)(lVar34 + 0xa0);
          fStack_1134 = *(float *)(lVar34 + 0xa4);
          fStack_1130 = *(float *)(lVar34 + 0xa8);
          fStack_112c = *(float *)(lVar34 + 0xac);
          local_1148 = *(float *)(lVar34 + 0xb0);
          fStack_1144 = *(float *)(lVar34 + 0xb4);
          fStack_1140 = *(float *)(lVar34 + 0xb8);
          fStack_113c = *(float *)(lVar34 + 0xbc);
        }
      }
LAB_00704a85:
      iVar132 = iStack_fbc;
      iVar130 = iStack_fc0;
      iVar128 = iStack_fc4;
      iVar27 = local_fc8;
      fVar60 = *(float *)(lVar34 + 0x60);
      fVar63 = *(float *)(lVar34 + 100);
      fVar66 = *(float *)(lVar34 + 0x68);
      fVar88 = *(float *)(lVar34 + 0x6c);
      fVar97 = *(float *)(lVar34 + 0x70);
      fVar102 = *(float *)(lVar34 + 0x74);
      fVar107 = *(float *)(lVar34 + 0x78);
      fVar159 = *(float *)(lVar34 + 0x7c);
      fVar69 = *(float *)(lVar34 + 0x80);
      fVar44 = *(float *)(lVar34 + 0x84);
      fVar62 = *(float *)(lVar34 + 0x88);
      fVar65 = *(float *)(lVar34 + 0x8c);
      local_1128 = fVar60 - local_1128;
      fStack_1124 = fVar63 - fStack_1124;
      fStack_1120 = fVar66 - fStack_1120;
      fStack_111c = fVar88 - fStack_111c;
      local_1138 = fVar97 - local_1138;
      fStack_1134 = fVar102 - fStack_1134;
      fStack_1130 = fVar107 - fStack_1130;
      fStack_112c = fVar159 - fStack_112c;
      local_1148 = fVar69 - local_1148;
      fStack_1144 = fVar44 - fStack_1144;
      fStack_1140 = fVar62 - fStack_1140;
      fStack_113c = fVar65 - fStack_113c;
      local_1118 = local_1118 - fVar60;
      fStack_1114 = fStack_1114 - fVar63;
      fStack_1110 = fStack_1110 - fVar66;
      fStack_110c = fStack_110c - fVar88;
      local_11f8._0_4_ = (float)local_11f8 - fVar97;
      local_11f8._4_4_ = local_11f8._4_4_ - fVar102;
      uStack_11f0._0_4_ = (float)uStack_11f0 - fVar107;
      uStack_11f0._4_4_ = uStack_11f0._4_4_ - fVar159;
      local_11b8._0_4_ = (float)local_11b8 - fVar69;
      local_11b8._4_4_ = local_11b8._4_4_ - fVar44;
      uStack_11b0._0_4_ = (float)uStack_11b0 - fVar62;
      uStack_11b0._4_4_ = uStack_11b0._4_4_ - fVar65;
      fVar60 = fVar60 - local_1108;
      fVar63 = fVar63 - fStack_1104;
      fVar66 = fVar66 - fStack_1100;
      fVar88 = fVar88 - fStack_10fc;
      fVar69 = fVar69 - local_fa8;
      fVar44 = fVar44 - fStack_fa4;
      fVar62 = fVar62 - fStack_fa0;
      fVar65 = fVar65 - fStack_f9c;
      fVar120 = fVar69 * local_f88 - fVar60 * fVar42;
      fVar121 = fVar44 * fStack_f84 - fVar63 * fVar42;
      fVar122 = fVar62 * fStack_f80 - fVar66 * fVar42;
      fVar123 = fVar65 * fStack_f7c - fVar88 * fVar42;
      fVar81 = local_1148 * (float)local_11f8 - local_1138 * (float)local_11b8;
      fVar84 = fStack_1144 * local_11f8._4_4_ - fStack_1134 * local_11b8._4_4_;
      fVar87 = fStack_1140 * (float)uStack_11f0 - fStack_1130 * (float)uStack_11b0;
      fVar91 = fStack_113c * uStack_11f0._4_4_ - fStack_112c * uStack_11b0._4_4_;
      local_11d8 = CONCAT44(fVar84,fVar81);
      fVar97 = fVar97 - local_f98;
      fVar102 = fVar102 - fStack_f94;
      fVar107 = fVar107 - fStack_f90;
      fVar159 = fVar159 - fStack_f8c;
      fVar68 = fVar60 * local_1008 - fVar97 * local_f88;
      fVar70 = fVar63 * fStack_1004 - fVar102 * fStack_f84;
      fVar71 = fVar66 * fStack_1000 - fVar107 * fStack_f80;
      fVar80 = fVar88 * fStack_ffc - fVar159 * fStack_f7c;
      fVar83 = local_1128 * (float)local_11b8 - local_1148 * local_1118;
      fVar86 = fStack_1124 * local_11b8._4_4_ - fStack_1144 * fStack_1114;
      fVar90 = fStack_1120 * (float)uStack_11b0 - fStack_1140 * fStack_1110;
      fVar92 = fStack_111c * uStack_11b0._4_4_ - fStack_113c * fStack_110c;
      fVar99 = local_1138 * local_1118 - local_1128 * (float)local_11f8;
      fVar100 = fStack_1134 * fStack_1114 - fStack_1124 * local_11f8._4_4_;
      local_1098 = CONCAT44(fVar100,fVar99);
      fVar101 = fStack_1130 * fStack_1110 - fStack_1120 * (float)uStack_11f0;
      fVar104 = fStack_112c * fStack_110c - fStack_111c * uStack_11f0._4_4_;
      auVar149._8_4_ = fVar101;
      auVar149._0_8_ = local_1098;
      auVar149._12_4_ = fVar104;
      fVar110 = fVar97 * fVar42 - fVar69 * local_1008;
      fVar111 = fVar102 * fVar42 - fVar44 * fStack_1004;
      fVar112 = fVar107 * fVar42 - fVar62 * fStack_1000;
      fVar113 = fVar159 * fVar42 - fVar65 * fStack_ffc;
      fVar105 = local_f88 * fVar81 + local_1008 * fVar83 + fVar42 * fVar99;
      fVar106 = fStack_f84 * fVar84 + fStack_1004 * fVar86 + fVar42 * fVar100;
      fVar109 = fStack_f80 * fVar87 + fStack_1000 * fVar90 + fVar42 * fVar101;
      fVar42 = fStack_f7c * fVar91 + fStack_ffc * fVar92 + fVar42 * fVar104;
      uVar61 = (uint)fVar105 & 0x80000000;
      uVar64 = (uint)fVar106 & 0x80000000;
      uVar67 = (uint)fVar109 & 0x80000000;
      uVar89 = (uint)fVar42 & 0x80000000;
      local_10f8._0_4_ =
           (uint)(local_1118 * fVar110 + (float)local_11f8 * fVar120 + (float)local_11b8 * fVar68) ^
           uVar61;
      local_10f8._4_4_ =
           (uint)(fStack_1114 * fVar111 + local_11f8._4_4_ * fVar121 + local_11b8._4_4_ * fVar70) ^
           uVar64;
      fStack_10f0 = (float)((uint)(fStack_1110 * fVar112 +
                                  (float)uStack_11f0 * fVar122 + (float)uStack_11b0 * fVar71) ^
                           uVar67);
      fStack_10ec = (float)((uint)(fStack_110c * fVar113 +
                                  uStack_11f0._4_4_ * fVar123 + uStack_11b0._4_4_ * fVar80) ^ uVar89
                           );
      local_10e8._0_4_ =
           (uint)(fVar110 * local_1128 + fVar120 * local_1138 + fVar68 * local_1148) ^ uVar61;
      local_10e8._4_4_ =
           (uint)(fVar111 * fStack_1124 + fVar121 * fStack_1134 + fVar70 * fStack_1144) ^ uVar64;
      fStack_10e0 = (float)((uint)(fVar112 * fStack_1120 +
                                  fVar122 * fStack_1130 + fVar71 * fStack_1140) ^ uVar67);
      fStack_10dc = (float)((uint)(fVar113 * fStack_111c +
                                  fVar123 * fStack_112c + fVar80 * fStack_113c) ^ uVar89);
      fVar68 = ABS(fVar105);
      fVar70 = ABS(fVar106);
      local_10c8._0_8_ = CONCAT44(fVar106,fVar105) & 0x7fffffff7fffffff;
      local_10c8._8_4_ = ABS(fVar109);
      local_10c8._12_4_ = ABS(fVar42);
      bVar22 = (float)local_10f8._0_4_ + (float)local_10e8._0_4_ <= fVar68 &&
               ((0.0 <= (float)local_10e8._0_4_ && 0.0 <= (float)local_10f8._0_4_) && fVar105 != 0.0
               );
      bVar23 = (float)local_10f8._4_4_ + (float)local_10e8._4_4_ <= fVar70 &&
               ((0.0 <= (float)local_10e8._4_4_ && 0.0 <= (float)local_10f8._4_4_) && fVar106 != 0.0
               );
      bVar21 = fStack_10f0 + fStack_10e0 <= local_10c8._8_4_ &&
               ((0.0 <= fStack_10e0 && 0.0 <= fStack_10f0) && fVar109 != 0.0);
      bVar20 = fStack_10ec + fStack_10dc <= local_10c8._12_4_ &&
               ((0.0 <= fStack_10dc && 0.0 <= fStack_10ec) && fVar42 != 0.0);
      auVar18._4_4_ = -(uint)bVar23;
      auVar18._0_4_ = -(uint)bVar22;
      auVar18._8_4_ = -(uint)bVar21;
      auVar18._12_4_ = -(uint)bVar20;
      uVar43 = movmskps(uVar43,auVar18);
      pauVar31 = (undefined1 (*) [16])(ulong)uVar43;
      if (uVar43 != 0) {
        local_10d8._0_4_ = uVar61 ^ (uint)(fVar60 * fVar81 + fVar97 * fVar83 + fVar69 * fVar99);
        local_10d8._4_4_ = uVar64 ^ (uint)(fVar63 * fVar84 + fVar102 * fVar86 + fVar44 * fVar100);
        fStack_10d0 = (float)(uVar67 ^ (uint)(fVar66 * fVar87 + fVar107 * fVar90 + fVar62 * fVar101)
                             );
        fStack_10cc = (float)(uVar89 ^ (uint)(fVar88 * fVar91 + fVar159 * fVar92 + fVar65 * fVar104)
                             );
        fVar42 = *(float *)(ray + k * 4 + 0x30);
        fVar60 = *(float *)(ray + k * 4 + 0x80);
        bVar14 = fVar42 * fVar68 < (float)local_10d8._0_4_;
        bVar15 = fVar42 * fVar70 < (float)local_10d8._4_4_;
        bVar16 = fVar42 * local_10c8._8_4_ < fStack_10d0;
        bVar17 = fVar42 * local_10c8._12_4_ < fStack_10cc;
        auVar55._4_4_ = -(uint)bVar15;
        auVar55._0_4_ = -(uint)bVar14;
        auVar55._8_4_ = -(uint)bVar16;
        auVar55._12_4_ = -(uint)bVar17;
        bVar22 = ((float)local_10d8._0_4_ <= fVar60 * fVar68 && bVar14) && bVar22;
        bVar23 = ((float)local_10d8._4_4_ <= fVar60 * fVar70 && bVar15) && bVar23;
        local_1188[0]._0_8_ = CONCAT44(-(uint)bVar23,-(uint)bVar22);
        bVar21 = (fStack_10d0 <= fVar60 * local_10c8._8_4_ && bVar16) && bVar21;
        local_1188[0]._8_4_ = -(uint)bVar21;
        bVar20 = (fStack_10cc <= fVar60 * local_10c8._12_4_ && bVar17) && bVar20;
        local_1188[0]._12_4_ = -(uint)bVar20;
        uVar43 = movmskps(uVar43,local_1188[0]);
        pauVar31 = (undefined1 (*) [16])(ulong)uVar43;
        if (uVar43 != 0) {
          local_10b8 = local_11d8;
          uStack_10b0 = CONCAT44(fVar91,fVar87);
          local_10a8 = CONCAT44(fVar86,fVar83);
          uStack_10a0 = CONCAT44(fVar92,fVar90);
          uStack_11e0 = auVar149._8_8_;
          uStack_1090 = uStack_11e0;
          local_1088 = local_1188[0];
          local_1018._8_8_ = uStack_fe0;
          local_1018._0_8_ = local_fe8;
          pSVar12 = context->scene;
          auVar93 = rcpps(auVar55,local_10c8);
          fVar42 = auVar93._0_4_;
          fVar60 = auVar93._4_4_;
          fVar63 = auVar93._8_4_;
          fVar66 = auVar93._12_4_;
          fVar97 = (float)DAT_01f46a60;
          fVar102 = DAT_01f46a60._4_4_;
          fVar107 = DAT_01f46a60._12_4_;
          fVar88 = DAT_01f46a60._8_4_;
          fVar42 = (fVar97 - fVar68 * fVar42) * fVar42 + fVar42;
          fVar60 = (fVar102 - fVar70 * fVar60) * fVar60 + fVar60;
          fVar63 = (fVar88 - local_10c8._8_4_ * fVar63) * fVar63 + fVar63;
          fVar66 = (fVar107 - local_10c8._12_4_ * fVar66) * fVar66 + fVar66;
          local_1058 = (undefined1  [8])
                       CONCAT44((float)local_10d8._4_4_ * fVar60,(float)local_10d8._0_4_ * fVar42);
          fStack_1050 = fStack_10d0 * fVar63;
          fStack_104c = fStack_10cc * fVar66;
          auVar151._0_4_ = (float)local_10f8._0_4_ * fVar42;
          auVar151._4_4_ = (float)local_10f8._4_4_ * fVar60;
          auVar151._8_4_ = fStack_10f0 * fVar63;
          auVar151._12_4_ = fStack_10ec * fVar66;
          auVar114 = minps(auVar151,_DAT_01f46a60);
          auVar76._0_4_ = fVar42 * (float)local_10e8._0_4_;
          auVar76._4_4_ = fVar60 * (float)local_10e8._4_4_;
          auVar76._8_4_ = fVar63 * fStack_10e0;
          auVar76._12_4_ = fVar66 * fStack_10dc;
          auVar93 = minps(auVar76,_DAT_01f46a60);
          auVar138._0_4_ = fVar97 - auVar114._0_4_;
          auVar138._4_4_ = fVar102 - auVar114._4_4_;
          auVar138._8_4_ = fVar88 - auVar114._8_4_;
          auVar138._12_4_ = fVar107 - auVar114._12_4_;
          auVar146._0_4_ = fVar97 - auVar93._0_4_;
          auVar146._4_4_ = fVar102 - auVar93._4_4_;
          auVar146._8_4_ = fVar88 - auVar93._8_4_;
          auVar146._12_4_ = fVar107 - auVar93._12_4_;
          local_1078 = blendvps(auVar114,auVar138,local_1018);
          local_1068 = blendvps(auVar93,auVar146,local_1018);
          local_1048 = local_11d8;
          uStack_1040 = CONCAT44(fVar91,fVar87);
          local_1038 = CONCAT44(fVar86,fVar83);
          uStack_1030 = CONCAT44(fVar92,fVar90);
          local_1028 = local_1098;
          uStack_1020 = uStack_11e0;
          auVar56._8_4_ = local_1188[0]._8_4_;
          auVar56._0_8_ = local_1188[0]._0_8_;
          auVar56._12_4_ = local_1188[0]._12_4_;
          auVar139._8_4_ = fStack_1050;
          auVar139._0_8_ = local_1058;
          auVar139._12_4_ = fStack_104c;
          auVar114 = blendvps(_DAT_01f45a30,_local_1058,auVar56);
          auVar96._4_4_ = auVar114._0_4_;
          auVar96._0_4_ = auVar114._4_4_;
          auVar96._8_4_ = auVar114._12_4_;
          auVar96._12_4_ = auVar114._8_4_;
          auVar93 = minps(auVar96,auVar114);
          auVar57._0_8_ = auVar93._8_8_;
          auVar57._8_4_ = auVar93._0_4_;
          auVar57._12_4_ = auVar93._4_4_;
          auVar93 = minps(auVar57,auVar93);
          auVar58._0_8_ =
               CONCAT44(-(uint)(auVar93._4_4_ == auVar114._4_4_ && bVar23),
                        -(uint)(auVar93._0_4_ == auVar114._0_4_ && bVar22));
          auVar58._8_4_ = -(uint)(auVar93._8_4_ == auVar114._8_4_ && bVar21);
          auVar58._12_4_ = -(uint)(auVar93._12_4_ == auVar114._12_4_ && bVar20);
          iVar28 = movmskps((int)pSVar12,auVar58);
          auVar118 = local_1188[0];
          if (iVar28 != 0) {
            auVar118._8_4_ = auVar58._8_4_;
            auVar118._0_8_ = auVar58._0_8_;
            auVar118._12_4_ = auVar58._12_4_;
          }
          uVar29 = movmskps(iVar28,auVar118);
          uVar32 = CONCAT44((int)((ulong)pSVar12 >> 0x20),uVar29);
          lVar40 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
            }
          }
          pRVar13 = (pSVar12->geometries).items;
          uVar43 = *(uint *)(ray + k * 4 + 0x90);
          while (uVar61 = *(uint *)(lVar34 + 0xc0 + lVar40 * 4),
                ((pRVar13[uVar61].ptr)->mask & uVar43) == 0) {
            *(undefined4 *)(local_1188[0] + lVar40 * 4) = 0;
            uVar29 = (undefined4)((ulong)lVar40 >> 0x20);
            iVar28 = movmskps((int)lVar40,local_1188[0]);
            pauVar31 = (undefined1 (*) [16])CONCAT44(uVar29,iVar28);
            if (iVar28 == 0) goto LAB_00704c64;
            auVar114 = blendvps(_DAT_01f45a30,auVar139,local_1188[0]);
            auVar119._4_4_ = auVar114._0_4_;
            auVar119._0_4_ = auVar114._4_4_;
            auVar119._8_4_ = auVar114._12_4_;
            auVar119._12_4_ = auVar114._8_4_;
            auVar93 = minps(auVar119,auVar114);
            auVar77._0_8_ = auVar93._8_8_;
            auVar77._8_4_ = auVar93._0_4_;
            auVar77._12_4_ = auVar93._4_4_;
            auVar93 = minps(auVar77,auVar93);
            auVar78._0_8_ =
                 CONCAT44(-(uint)(auVar93._4_4_ == auVar114._4_4_) & local_1188[0]._4_4_,
                          -(uint)(auVar93._0_4_ == auVar114._0_4_) & local_1188[0]._0_4_);
            auVar78._8_4_ = -(uint)(auVar93._8_4_ == auVar114._8_4_) & local_1188[0]._8_4_;
            auVar78._12_4_ = -(uint)(auVar93._12_4_ == auVar114._12_4_) & local_1188[0]._12_4_;
            iVar28 = movmskps(iVar28,auVar78);
            auVar59 = local_1188[0];
            if (iVar28 != 0) {
              auVar59._8_4_ = auVar78._8_4_;
              auVar59._0_8_ = auVar78._0_8_;
              auVar59._12_4_ = auVar78._12_4_;
            }
            uVar30 = movmskps(iVar28,auVar59);
            uVar32 = CONCAT44(uVar29,uVar30);
            lVar40 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
          }
          uVar29 = *(undefined4 *)(local_1078 + lVar40 * 4);
          uVar30 = *(undefined4 *)(local_1068 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1058 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_1048 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_1038 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_1028 + lVar40 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar30;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_ff8 + lVar40 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar61;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar43 = context->user->instPrimID[0];
          pauVar31 = (undefined1 (*) [16])(ulong)uVar43;
          *(uint *)(ray + k * 4 + 0x140) = uVar43;
        }
      }
LAB_00704c64:
    }
    iVar28 = *(int *)(ray + k * 4 + 0x80);
    iVar79 = iVar28;
    iVar82 = iVar28;
    iVar85 = iVar28;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }